

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCases.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::Texture2DRenderCase::setupProgram
          (Texture2DRenderCase *this,deUint32 program)

{
  code *pcVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  int local_9c;
  allocator<char> local_95;
  deUint32 local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_94 = program;
  iVar2 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[3])();
  for (local_9c = 0; local_9c < this->m_numTextures; local_9c = local_9c + 1) {
    pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0xb48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"u_sampler",&local_95);
    de::toString<int>(&local_70,&local_9c);
    std::operator+(&local_90,&local_50,&local_70);
    uVar3 = (*pcVar1)(local_94,local_90._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x14f0))(uVar3,local_9c);
  }
  return;
}

Assistant:

void Texture2DRenderCase::setupProgram (deUint32 program)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();
	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		int samplerLoc = gl.getUniformLocation(program, (string("u_sampler") + de::toString(texNdx)).c_str());
		gl.uniform1i(samplerLoc, texNdx);
	}
}